

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::ShowMetricsWindow(bool *p_popen)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ImU32 IVar4;
  ImPlotPlot *pIVar5;
  char *pcVar6;
  ImGuiStyle *pIVar7;
  float fVar8;
  char *local_d0;
  ImVec2 local_c8;
  undefined1 local_c0 [8];
  ImVec4 col;
  int c;
  ImVec4 local_a4;
  ImVec2 local_94;
  float local_8c;
  undefined1 local_88 [4];
  float wid;
  ImVec4 samp;
  bool qual;
  int size;
  int count;
  int m;
  ImVec4 temp;
  ImPlotItem *item;
  int i;
  int n_items;
  ImPlotPlot *plot;
  int p;
  int n_plots;
  ImVec2 local_30;
  ImGuiIO *local_28;
  ImGuiIO *io;
  ImPlotContext *gp;
  ImDrawList *fg;
  bool *p_popen_local;
  
  fg = (ImDrawList *)p_popen;
  gp = (ImPlotContext *)ImGui::GetForegroundDrawList();
  io = (ImGuiIO *)GImPlot;
  local_28 = ImGui::GetIO();
  ImGui::Begin("ImPlot Metrics",(bool *)fg,0);
  ImGui::Text("ImPlot 0.10 WIP");
  ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / local_28->Framerate))
  ;
  ImGui::Separator();
  bVar1 = ImGui::TreeNode("Tools");
  if (bVar1) {
    ImVec2::ImVec2(&local_30,0.0,0.0);
    bVar1 = ImGui::Button("Bust Plot Cache",&local_30);
    if (bVar1) {
      BustPlotCache();
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2((ImVec2 *)&p,0.0,0.0);
    bVar1 = ImGui::Button("Bust Item Cache",(ImVec2 *)&p);
    if (bVar1) {
      BustItemCache();
    }
    ImGui::Checkbox("Show Plot Rects",&ShowMetricsWindow::show_plot_rects);
    ImGui::Checkbox("Show Axes Rects",&ShowMetricsWindow::show_axes_rects);
    ImGui::TreePop();
  }
  uVar2 = ImPool<ImPlotPlot>::GetBufSize((ImPool<ImPlotPlot> *)io);
  bVar1 = ImGui::TreeNode("Plots","Plots (%d)",(ulong)uVar2);
  if (bVar1) {
    for (plot._0_4_ = 0; (int)plot < (int)uVar2; plot._0_4_ = (int)plot + 1) {
      pIVar5 = ImPool<ImPlotPlot>::GetByIndex((ImPool<ImPlotPlot> *)io,(int)plot);
      ImGui::PushID((int)plot);
      bVar1 = ImGui::TreeNode("Plot","Plot [ID=%u]",(ulong)pIVar5->ID);
      if (bVar1) {
        uVar3 = ImPool<ImPlotItem>::GetBufSize(&pIVar5->Items);
        bVar1 = ImGui::TreeNode("Items","Items (%d)",(ulong)uVar3);
        if (bVar1) {
          for (item._0_4_ = 0; (int)item < (int)uVar3; item._0_4_ = (int)item + 1) {
            temp._8_8_ = ImPool<ImPlotItem>::GetByIndex(&pIVar5->Items,(int)item);
            ImGui::PushID((int)item);
            bVar1 = ImGui::TreeNode("Item","Item [ID=%u]",(ulong)*(uint *)temp._8_8_);
            if (bVar1) {
              ImGui::Bullet();
              ImGui::Checkbox("Show",(bool *)(temp._8_8_ + 0xc));
              ImGui::Bullet();
              _count = ImGui::ColorConvertU32ToFloat4(*(ImU32 *)(temp._8_8_ + 4));
              bVar1 = ImGui::ColorEdit4("Color",(float *)&count,0x20);
              if (bVar1) {
                IVar4 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&count);
                *(ImU32 *)(temp._8_8_ + 4) = IVar4;
              }
              ImGui::Bullet();
              ImGui::Text("NameOffset: %d",(ulong)*(uint *)(temp._8_8_ + 8));
              ImGui::Bullet();
              if (*(int *)(temp._8_8_ + 8) == -1) {
                local_d0 = "N/A";
              }
              else {
                local_d0 = (pIVar5->LegendData).Labels.Buf.Data + *(int *)(temp._8_8_ + 8);
              }
              ImGui::Text("Name: %s",local_d0);
              ImGui::Bullet();
              pcVar6 = "false";
              if ((*(byte *)(temp._8_8_ + 0xd) & 1) != 0) {
                pcVar6 = "true";
              }
              ImGui::Text("Hovered: %s",pcVar6);
              ImGui::TreePop();
            }
            ImGui::PopID();
          }
          ImGui::TreePop();
        }
        bVar1 = ImGui::TreeNode("X-Axis");
        if (bVar1) {
          ShowAxisMetrics(&pIVar5->XAxis,(bool)(ShowMetricsWindow::show_axes_rects & 1));
          ImGui::TreePop();
        }
        bVar1 = ImGui::TreeNode("Y-Axis");
        if (bVar1) {
          ShowAxisMetrics(pIVar5->YAxis,(bool)(ShowMetricsWindow::show_axes_rects & 1));
          ImGui::TreePop();
        }
        bVar1 = ImHasFlag<int,ImPlotFlags_>(pIVar5->Flags,ImPlotFlags_YAxis2);
        if ((bVar1) && (bVar1 = ImGui::TreeNode("Y-Axis 2"), bVar1)) {
          ShowAxisMetrics(pIVar5->YAxis + 1,(bool)(ShowMetricsWindow::show_axes_rects & 1));
          ImGui::TreePop();
        }
        bVar1 = ImHasFlag<int,ImPlotFlags_>(pIVar5->Flags,ImPlotFlags_YAxis3);
        if ((bVar1) && (bVar1 = ImGui::TreeNode("Y-Axis 3"), bVar1)) {
          ShowAxisMetrics(pIVar5->YAxis + 2,(bool)(ShowMetricsWindow::show_axes_rects & 1));
          ImGui::TreePop();
        }
        ImGui::Bullet();
        ImGui::Text("Flags: %d",(ulong)(uint)pIVar5->Flags);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->Initialized & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("Initialized: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->Selecting & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("Selecting: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->Selected & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("Selected: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->Querying & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("Querying: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->Queried & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("Queried: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->FrameHovered & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("FrameHovered: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->PlotHovered & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("PlotHovered: %s",pcVar6);
        ImGui::Bullet();
        pcVar6 = "false";
        if ((pIVar5->LegendHovered & 1U) != 0) {
          pcVar6 = "true";
        }
        ImGui::Text("LegendHovered: %s",pcVar6);
        ImGui::TreePop();
        if ((ShowMetricsWindow::show_plot_rects & 1U) != 0) {
          ImDrawList::AddRect((ImDrawList *)gp,&(pIVar5->PlotRect).Min,&(pIVar5->PlotRect).Max,
                              0xff00ffff,0.0,0,1.0);
        }
      }
      ImGui::PopID();
    }
    ImGui::TreePop();
  }
  bVar1 = ImGui::TreeNode("Colormaps");
  if (bVar1) {
    ImGui::BulletText("Colormaps:  %d",(ulong)(uint)io->KeysDownDuration[0x2e]);
    ImGui::BulletText("Memory: %d bytes",(ulong)(uint)((int)io->KeysDownDuration[0x12] << 2));
    bVar1 = ImGui::TreeNode("Data");
    if (bVar1) {
      for (size = 0; size < (int)io->KeysDownDuration[0x2e]; size = size + 1) {
        pcVar6 = ImPlotColormapData::GetName((ImPlotColormapData *)(io->KeysDownDuration + 6),size);
        bVar1 = ImGui::TreeNode(pcVar6);
        if (bVar1) {
          uVar2 = ImPlotColormapData::GetKeyCount
                            ((ImPlotColormapData *)(io->KeysDownDuration + 6),size);
          samp.w = (float)ImPlotColormapData::GetTableSize
                                    ((ImPlotColormapData *)(io->KeysDownDuration + 6),size);
          samp.z._3_1_ = ImPlotColormapData::IsQual
                                   ((ImPlotColormapData *)(io->KeysDownDuration + 6),size);
          pcVar6 = "false";
          if ((bool)samp.z._3_1_) {
            pcVar6 = "true";
          }
          ImGui::BulletText("Qualitative: %s",pcVar6);
          ImGui::BulletText("Key Count: %d",(ulong)uVar2);
          ImGui::BulletText("Table Size: %d",(ulong)(uint)samp.w);
          ImGui::Indent(0.0);
          ImVec4::ImVec4((ImVec4 *)local_88);
          fVar8 = ImGui::GetFrameHeight();
          pIVar7 = ImGui::GetStyle();
          local_8c = (320.0 - fVar8) - (pIVar7->ItemSpacing).x;
          ImGui::SetNextItemWidth(local_8c);
          ColormapSlider("##Sample",&ShowMetricsWindow::t,(ImVec4 *)local_88,"%.3f",size);
          ImGui::SameLine(0.0,-1.0);
          ImVec2::ImVec2(&local_94,0.0,0.0);
          ImGui::ColorButton("Sampler",(ImVec4 *)local_88,0,local_94);
          ImVec4::ImVec4(&local_a4,0.0,0.0,0.0,0.0);
          ImGui::PushStyleColor(7,&local_a4);
          ImVec2::ImVec2((ImVec2 *)&col.w,0.0,0.0);
          ImGui::PushStyleVar(0xd,(ImVec2 *)&col.w);
          for (col.z = 0.0; (int)col.z < (int)samp.w; col.z = (float)((int)col.z + 1)) {
            IVar4 = ImPlotColormapData::GetTableColor
                              ((ImPlotColormapData *)(io->KeysDownDuration + 6),size,(int)col.z);
            _local_c0 = ImGui::ColorConvertU32ToFloat4(IVar4);
            ImGui::PushID(size * 1000 + (int)col.z);
            ImVec2::ImVec2(&local_c8,10.0,10.0);
            ImGui::ColorButton("",(ImVec4 *)local_c0,0,local_c8);
            ImGui::PopID();
            if ((((int)col.z + 1) % 0x20 != 0) && (col.z != (float)((int)samp.w + -1))) {
              ImGui::SameLine(0.0,-1.0);
            }
          }
          ImGui::PopStyleVar(1);
          ImGui::PopStyleColor(1);
          ImGui::Unindent(0.0);
          ImGui::TreePop();
        }
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  ImGui::End();
  return;
}

Assistant:

void ShowMetricsWindow(bool* p_popen) {

    static bool show_plot_rects = false;
    static bool show_axes_rects = false;

    ImDrawList& fg = *ImGui::GetForegroundDrawList();

    ImPlotContext& gp = *GImPlot;
    // ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Begin("ImPlot Metrics", p_popen);
    ImGui::Text("ImPlot " IMPLOT_VERSION);
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Separator();
    if (ImGui::TreeNode("Tools")) {
        if (ImGui::Button("Bust Plot Cache"))
            BustPlotCache();
        ImGui::SameLine();
        if (ImGui::Button("Bust Item Cache"))
            BustItemCache();
        ImGui::Checkbox("Show Plot Rects", &show_plot_rects);
        ImGui::Checkbox("Show Axes Rects", &show_axes_rects);
        ImGui::TreePop();
    }
    const int n_plots = gp.Plots.GetBufSize();
    if (ImGui::TreeNode("Plots","Plots (%d)", n_plots)) {
        for (int p = 0; p < n_plots; ++p) {
            // plot
            ImPlotPlot* plot = gp.Plots.GetByIndex(p);
            ImGui::PushID(p);
            if (ImGui::TreeNode("Plot", "Plot [ID=%u]", plot->ID)) {
                int n_items = plot->Items.GetBufSize();
                if (ImGui::TreeNode("Items", "Items (%d)", n_items)) {
                    for (int i = 0; i < n_items; ++i) {
                        ImPlotItem* item = plot->Items.GetByIndex(i);
                        ImGui::PushID(i);
                        if (ImGui::TreeNode("Item", "Item [ID=%u]", item->ID)) {
                            ImGui::Bullet(); ImGui::Checkbox("Show", &item->Show);
                            ImGui::Bullet();
                            ImVec4 temp = ImGui::ColorConvertU32ToFloat4(item->Color);
                            if (ImGui::ColorEdit4("Color",&temp.x, ImGuiColorEditFlags_NoInputs))
                                item->Color = ImGui::ColorConvertFloat4ToU32(temp);

                            ImGui::Bullet(); ImGui::Text("NameOffset: %d",item->NameOffset);
                            ImGui::Bullet(); ImGui::Text("Name: %s", item->NameOffset != -1 ? plot->LegendData.Labels.Buf.Data + item->NameOffset : "N/A");
                            ImGui::Bullet(); ImGui::Text("Hovered: %s",item->LegendHovered ? "true" : "false");
                            ImGui::TreePop();
                        }
                        ImGui::PopID();
                    }
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("X-Axis")) {
                    ShowAxisMetrics(&plot->XAxis, show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("Y-Axis")) {
                    ShowAxisMetrics(&plot->YAxis[0], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis2) && ImGui::TreeNode("Y-Axis 2")) {
                    ShowAxisMetrics(&plot->YAxis[1], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis3) && ImGui::TreeNode("Y-Axis 3")) {
                    ShowAxisMetrics(&plot->YAxis[2], show_axes_rects);
                    ImGui::TreePop();
                }
                ImGui::Bullet(); ImGui::Text("Flags: %d", plot->Flags);
                ImGui::Bullet(); ImGui::Text("Initialized: %s", plot->Initialized ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selecting: %s", plot->Selecting ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selected: %s", plot->Selected ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Querying: %s", plot->Querying ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Queried: %s", plot->Queried ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("FrameHovered: %s", plot->FrameHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("PlotHovered: %s", plot->PlotHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("LegendHovered: %s", plot->LegendHovered ? "true" : "false");
                ImGui::TreePop();
                if (show_plot_rects)
                    fg.AddRect(plot->PlotRect.Min, plot->PlotRect.Max, IM_COL32(255,255,0,255));
            }
            ImGui::PopID();
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Colormaps")) {
        ImGui::BulletText("Colormaps:  %d", gp.ColormapData.Count);
        ImGui::BulletText("Memory: %d bytes", gp.ColormapData.Tables.Size * 4);
        if (ImGui::TreeNode("Data")) {
            for (int m = 0; m < gp.ColormapData.Count; ++m) {
                if (ImGui::TreeNode(gp.ColormapData.GetName(m))) {
                    int count = gp.ColormapData.GetKeyCount(m);
                    int size = gp.ColormapData.GetTableSize(m);
                    bool qual = gp.ColormapData.IsQual(m);
                    ImGui::BulletText("Qualitative: %s", qual ? "true" : "false");
                    ImGui::BulletText("Key Count: %d", count);
                    ImGui::BulletText("Table Size: %d", size);
                    ImGui::Indent();

                    static float t = 0.5;
                    ImVec4 samp;
                    float wid = 32 * 10 - ImGui::GetFrameHeight() - ImGui::GetStyle().ItemSpacing.x;
                    ImGui::SetNextItemWidth(wid);
                    ImPlot::ColormapSlider("##Sample",&t,&samp,"%.3f",m);
                    ImGui::SameLine();
                    ImGui::ColorButton("Sampler",samp);
                    ImGui::PushStyleColor(ImGuiCol_FrameBg, ImVec4(0,0,0,0));
                    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
                    for (int c = 0; c < size; ++c) {
                        ImVec4 col = ImGui::ColorConvertU32ToFloat4(gp.ColormapData.GetTableColor(m,c));
                        ImGui::PushID(m*1000+c);
                        ImGui::ColorButton("",col,0,ImVec2(10,10));
                        ImGui::PopID();
                        if ((c + 1) % 32 != 0 && c != size - 1)
                            ImGui::SameLine();
                    }
                    ImGui::PopStyleVar();
                    ImGui::PopStyleColor();
                    ImGui::Unindent();
                    ImGui::TreePop();
                }
            }
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }
    ImGui::End();
}